

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O0

void __thiscall polyscope::SurfaceCountQuantity::createProgram(SurfaceCountQuantity *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  long *plVar1;
  bool bVar2;
  element_type *peVar3;
  SurfaceMesh *this_00;
  long in_RDI;
  pair<glm::vec<3,_float,_(glm::qualifier)0>,_double> *e;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
  *__range1;
  vector<double,_std::allocator<double>_> value;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  pos;
  vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
  *in_stack_fffffffffffffd88;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffd90;
  value_type *in_stack_fffffffffffffd98;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffda0;
  allocator_type *in_stack_fffffffffffffdb8;
  allocator *paVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc0;
  iterator in_stack_fffffffffffffdc8;
  size_type in_stack_fffffffffffffdd0;
  string *local_1f8;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [8];
  string *in_stack_fffffffffffffe80;
  ShaderProgram *in_stack_fffffffffffffe88;
  Engine *in_stack_fffffffffffffe90;
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  reference local_118;
  pair<glm::vec<3,_float,_(glm::qualifier)0>,_double> *local_110;
  __normal_iterator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_*,_std::vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>_>
  local_108;
  long local_100;
  undefined1 local_f8 [24];
  undefined1 local_e0 [29];
  undefined1 local_c3;
  allocator local_c2;
  allocator local_c1;
  string *local_c0;
  string local_b8 [32];
  string local_98 [32];
  string *local_78;
  undefined8 local_70;
  undefined1 local_68 [47];
  allocator local_39;
  string local_38 [32];
  undefined1 local_18 [24];
  
  plVar1 = render::engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"RAYCAST_SPHERE",&local_39);
  local_c3 = 1;
  local_c0 = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"SPHERE_PROPAGATE_VALUE",&local_c1);
  local_c0 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"SHADE_COLORMAP_VALUE",&local_c2);
  local_c3 = 0;
  local_78 = local_b8;
  local_70 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x3c6d6b);
  __l._M_len = in_stack_fffffffffffffdd0;
  __l._M_array = in_stack_fffffffffffffdc8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffdc0,__l,in_stack_fffffffffffffdb8);
  (**(code **)(*plVar1 + 0x118))(local_18,plVar1,local_38,local_68,0);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffd90,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffd88);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x3c6dec);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffda0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x3c6e06);
  local_1f8 = (string *)&local_78;
  do {
    local_1f8 = local_1f8 + -0x20;
    std::__cxx11::string::~string(local_1f8);
  } while (local_1f8 != local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c2);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x3c6e8d);
  geometrycentral::surface::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3c6e9a);
  local_100 = in_RDI + 0x80;
  local_108._M_current =
       (pair<glm::vec<3,_float,_(glm::qualifier)0>,_double> *)
       std::
       vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
       ::begin(in_stack_fffffffffffffd88);
  local_110 = (pair<glm::vec<3,_float,_(glm::qualifier)0>,_double> *)
              std::
              vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
              ::end(in_stack_fffffffffffffd88);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_*,_std::vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>_>
                        *)in_stack_fffffffffffffd90,
                       (__normal_iterator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_*,_std::vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>_>
                        *)in_stack_fffffffffffffd88);
    if (!bVar2) break;
    local_118 = __gnu_cxx::
                __normal_iterator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_*,_std::vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>_>
                ::operator*(&local_108);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffda0,(value_type_conflict2 *)in_stack_fffffffffffffd98);
    __gnu_cxx::
    __normal_iterator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_*,_std::vector<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>_>
    ::operator++(&local_108);
  }
  peVar3 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3c70d6);
  paVar4 = &local_139;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"a_position",paVar4);
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_138,local_e0,0,0,0xffffffff);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  peVar3 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3c7165);
  paVar4 = &local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"a_value",paVar4);
  (*peVar3->_vptr_ShaderProgram[0x12])(peVar3,local_160,local_f8,0,0,0xffffffff);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  peVar3 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3c71f4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"t_colormap",&local_189);
  this_00 = (SurfaceMesh *)
            PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::get((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(in_RDI + 0x108));
  (*peVar3->_vptr_ShaderProgram[0x19])(peVar3,local_188,this_00,0);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffd90);
  SurfaceMesh::getMaterial_abi_cxx11_(this_00);
  render::Engine::setMaterial
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_1b0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)peVar3);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)peVar3);
  return;
}

Assistant:

void SurfaceCountQuantity::createProgram() {

  program = render::engine->requestShader("RAYCAST_SPHERE", {"SPHERE_PROPAGATE_VALUE", "SHADE_COLORMAP_VALUE"});


  // Fill buffers
  std::vector<glm::vec3> pos;
  std::vector<double> value;
  for (auto& e : entries) {
    pos.push_back(e.first);
    value.push_back(e.second);
  }


  // Store data in buffers
  program->setAttribute("a_position", pos);
  program->setAttribute("a_value", value);

  program->setTextureFromColormap("t_colormap", colorMap.get());
  render::engine->setMaterial(*program, parent.getMaterial());
}